

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_limit.cpp
# Opt level: O3

bool __thiscall
ON_SubDQuadNeighborhood::Set(ON_SubDQuadNeighborhood *this,ON_SubDFace *center_quad_face)

{
  int iVar1;
  long lVar2;
  long lVar3;
  ON_SubDVertex *pOVar4;
  bool bVar5;
  uchar uVar6;
  ON_SubDFace *pOVar8;
  ON_SubDVertex *pOVar9;
  ON_SubDVertex *pOVar10;
  ON_SubDEdgePtr OVar11;
  ON_SubDFace *pOVar12;
  long *plVar13;
  ulong uVar14;
  ON_SubDSectorIterator *pOVar15;
  undefined8 *puVar16;
  ON_SubDEdge *(*papOVar17) [2];
  uint qfei;
  long lVar18;
  undefined4 uVar19;
  ON_SubDEdge *pOVar20;
  ulong uVar21;
  byte bVar22;
  bool bIsDartVertex [4];
  bool bIsCreaseEdge [4];
  ON_SubDFace *corner_faces [4];
  ON_SubDFace *qf_nbr_face [4];
  ON_SubDVertex *qf_vertex [4];
  ON_SubDVertex *outer_vertex [12];
  ON_SubDSectorIterator sit1;
  ON_SubDSectorIterator sit0;
  ulong local_1e8;
  StopAt aSStack_1dc [4];
  ON_SubDVertex *local_1d8;
  ON_SubDVertex *local_1d0;
  long local_1c8;
  ulong local_1c0;
  undefined4 local_1b8;
  char acStack_1b4 [4];
  long *local_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [24];
  ON_SubDEdge *(*local_160) [2];
  ON_SubDEdge *(*local_158) [2];
  ulong local_150;
  ON_SubDVertex *local_148 [4];
  undefined1 local_128 [8];
  ON_SubDVertex *pOStack_120;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [32];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  int local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  int local_38;
  uint uVar7;
  
  bVar22 = 0;
  Internal_Destroy(this,true);
  this->m_fsh = (ON_SubD_FixedSizeHeap *)0x0;
  if (center_quad_face == (ON_SubDFace *)0x0) {
LAB_006190e4:
    bVar5 = true;
  }
  else {
    if (center_quad_face->m_edge_count == 4) {
      lVar18 = 0;
      do {
        uVar14 = center_quad_face->m_edge4[lVar18].m_ptr;
        pOVar20 = (ON_SubDEdge *)(uVar14 & 0xfffffffffffffff8);
        if (((pOVar20 == (ON_SubDEdge *)0x0) || (pOVar20->m_vertex[0] == (ON_SubDVertex *)0x0)) ||
           (pOVar20->m_vertex[1] == (ON_SubDVertex *)0x0)) goto LAB_00618b79;
        bVar5 = ON_SubDEdge::IsCrease(pOVar20);
        acStack_1b4[lVar18] = bVar5;
        this->m_center_edges[lVar18] = pOVar20;
        pOVar9 = pOVar20->m_vertex[(uint)uVar14 & 1];
        local_148[lVar18] = pOVar9;
        bVar5 = ON_SubDVertex::IsDart(pOVar9);
        aSStack_1dc[lVar18] = bVar5;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 4);
      lVar18 = 0x14;
      do {
        if (lVar18 == 0x18) {
          local_178._0_16_ = (undefined1  [16])0x0;
          local_188 = (undefined1  [16])0x0;
          lVar18 = 0;
          do {
            if (((acStack_1b4[lVar18] == '\x01') && (aSStack_1dc[lVar18] == Boundary)) &&
               (aSStack_1dc[(int)lVar18 + 1U & 3] == Boundary)) {
              this->m_bBoundaryCrease[lVar18] = true;
              this->m_boundary_crease_count = this->m_boundary_crease_count + '\x01';
            }
            else {
              pOVar8 = ON_SubDEdge::NeighborFace
                                 (this->m_center_edges[lVar18],center_quad_face,false);
              *(ON_SubDFace **)(local_188 + lVar18 * 8) = pOVar8;
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 != 4);
          local_38 = 0;
          local_48 = (undefined1  [16])0x0;
          local_58 = (undefined1  [16])0x0;
          local_68 = (undefined1  [16])0x0;
          local_78 = (undefined1  [16])0x0;
          local_1e8 = 0;
          local_88 = 0;
          local_98 = (undefined1  [16])0x0;
          local_a8 = (undefined1  [16])0x0;
          local_c8._16_16_ = (undefined1  [16])0x0;
          local_c8._0_16_ = (undefined1  [16])0x0;
          this->m_face_grid[1][1] = center_quad_face;
          this->m_face_grid[1][0] = (ON_SubDFace *)local_188._0_8_;
          this->m_face_grid[2][1] = (ON_SubDFace *)local_188._8_8_;
          this->m_face_grid[1][2] = (ON_SubDFace *)local_178._0_8_;
          this->m_face_grid[0][1] = (ON_SubDFace *)local_178._8_8_;
          this->m_vertex_grid[1][1] = local_148[0];
          this->m_vertex_grid[2][1] = local_148[1];
          this->m_vertex_grid[2][2] = local_148[2];
          this->m_vertex_grid[1][2] = local_148[3];
          local_198 = (undefined1  [16])0x0;
          local_1a8 = (undefined1  [16])0x0;
          plVar13 = (long *)(local_128 + 8);
          local_d8 = (undefined1  [16])0x0;
          local_e8 = (undefined1  [16])0x0;
          local_f8 = (undefined1  [16])0x0;
          local_108 = (undefined1  [16])0x0;
          local_118 = (undefined1  [16])0x0;
          _local_128 = (undefined1  [16])0x0;
          papOVar17 = this->m_edge_grid;
          uVar14 = 0xffffffff;
          local_160 = papOVar17;
          bVar5 = false;
          do {
            local_1c0 = (ulong)((uint)local_1e8 - 1 & 3);
            if ((*(ON_SubDVertex **)(local_188 + local_1e8 * 8) != (ON_SubDVertex *)0x0) ||
               (*(long *)(local_188 + local_1c0 * 8) != 0)) {
              local_1d0 = *(ON_SubDVertex **)(local_188 + local_1e8 * 8);
              local_1b0 = plVar13;
              local_158 = papOVar17;
              local_150 = uVar14;
              pOVar9 = ON_SubDSectorIterator::Initialize
                                 ((ON_SubDSectorIterator *)local_78,center_quad_face,0,
                                  (uint)local_1e8);
              if (pOVar9 == (ON_SubDVertex *)0x0) goto LAB_006190cb;
              pOVar9 = local_148[local_1e8];
              pOVar10 = ON_SubDSectorIterator::CenterVertex((ON_SubDSectorIterator *)local_78);
              pOVar4 = local_1d0;
              if (pOVar9 != pOVar10) goto LAB_006190cb;
              pOVar15 = (ON_SubDSectorIterator *)local_78;
              puVar16 = (undefined8 *)local_c8;
              for (lVar18 = 8; lVar18 != 0; lVar18 = lVar18 + -1) {
                *puVar16 = pOVar15->m_center_vertex;
                pOVar15 = (ON_SubDSectorIterator *)((long)pOVar15 + (ulong)bVar22 * -0x10 + 8);
                puVar16 = puVar16 + (ulong)bVar22 * -2 + 1;
              }
              local_88 = local_38;
              if (pOVar9->m_edge_count == 4) {
                uVar19 = (undefined4)CONCAT71((int7)((ulong)pOVar9 >> 8),2 < pOVar9->m_face_count);
              }
              else {
                uVar19 = 0;
              }
              local_1d8 = pOVar9;
              local_1b8 = uVar19;
              if (local_1d0 == (ON_SubDVertex *)0x0) {
                pOVar20 = (ON_SubDEdge *)0x0;
                local_1d0 = (ON_SubDVertex *)0x0;
                goto LAB_00618e6f;
              }
              pOVar9 = (ON_SubDVertex *)
                       ON_SubDSectorIterator::PrevFace((ON_SubDSectorIterator *)local_78,Boundary);
              if (pOVar4 != pOVar9) goto LAB_006190cb;
              OVar11 = ON_SubDSectorIterator::CurrentEdgePtr((ON_SubDSectorIterator *)local_78,0);
              pOVar20 = (ON_SubDEdge *)(OVar11.m_ptr & 0xfffffffffffffff8);
              if ((pOVar20 == (ON_SubDEdge *)0x0) ||
                 (pOVar20->m_vertex[~(uint)OVar11.m_ptr & 1] == (ON_SubDVertex *)0x0))
              goto LAB_006190cb;
              local_1d0 = pOVar20->m_vertex[~(uint)OVar11.m_ptr & 1];
              if ((char)uVar19 == '\0') {
LAB_00618e6f:
                pOVar8 = *(ON_SubDFace **)(local_188 + local_1c0 * 8);
                if (pOVar8 == (ON_SubDFace *)0x0) {
                  uVar21 = 0;
                  lVar18 = 0;
                }
                else {
                  pOVar12 = ON_SubDSectorIterator::NextFace
                                      ((ON_SubDSectorIterator *)local_c8,Boundary);
                  if (pOVar8 != pOVar12) {
LAB_006190cb:
                    ON_SubDIncrementErrorCount();
                    return bVar5;
                  }
                  OVar11 = ON_SubDSectorIterator::CurrentEdgePtr
                                     ((ON_SubDSectorIterator *)local_c8,1);
                  uVar21 = OVar11.m_ptr & 0xfffffffffffffff8;
                  if ((uVar21 == 0) ||
                     (local_1c8 = *(long *)(uVar21 + 0x80 + (ulong)(~(uint)OVar11.m_ptr & 1) * 8),
                     local_1c8 == 0)) goto LAB_006190cb;
                  lVar18 = local_1c8;
                  if (((char)local_1b8 != '\0') && (*(long *)(local_1a8 + local_1e8 * 8) == 0)) {
                    pOVar8 = ON_SubDSectorIterator::NextFace
                                       ((ON_SubDSectorIterator *)local_c8,
                                        aSStack_1dc[local_1c0] ^ AnyCrease);
                    *(ON_SubDFace **)(local_1a8 + local_1e8 * 8) = pOVar8;
                    lVar18 = local_1c8;
                    if ((pOVar20 == (ON_SubDEdge *)0x0) && (pOVar8 != (ON_SubDFace *)0x0)) {
                      OVar11 = ON_SubDSectorIterator::CurrentEdgePtr
                                         ((ON_SubDSectorIterator *)local_c8,1);
                      pOVar20 = (ON_SubDEdge *)(OVar11.m_ptr & 0xfffffffffffffff8);
                      if ((pOVar20 == (ON_SubDEdge *)0x0) ||
                         (pOVar20->m_vertex[~(uint)OVar11.m_ptr & 1] == (ON_SubDVertex *)0x0))
                      goto LAB_006190cb;
                      local_1d0 = pOVar20->m_vertex[~(uint)OVar11.m_ptr & 1];
                      lVar18 = local_1c8;
                    }
                  }
                }
              }
              else {
                pOVar8 = ON_SubDSectorIterator::PrevFace
                                   ((ON_SubDSectorIterator *)local_78,
                                    aSStack_1dc[local_1e8] ^ AnyCrease);
                *(ON_SubDFace **)(local_1a8 + local_1e8 * 8) = pOVar8;
                if (pOVar8 == (ON_SubDFace *)0x0) goto LAB_00618e6f;
                OVar11 = ON_SubDSectorIterator::CurrentEdgePtr((ON_SubDSectorIterator *)local_78,0);
                uVar21 = OVar11.m_ptr & 0xfffffffffffffff8;
                if ((uVar21 == 0) ||
                   (lVar18 = *(long *)(uVar21 + 0x80 + (ulong)(~(uint)OVar11.m_ptr & 1) * 8),
                   lVar18 == 0)) goto LAB_006190cb;
              }
              if (*(ON_SubDFace **)(local_1a8 + local_1e8 * 8) != (ON_SubDFace *)0x0) {
                pOVar9 = ON_SubDFace::QuadOppositeVertex
                                   (*(ON_SubDFace **)(local_1a8 + local_1e8 * 8),local_1d8);
                local_1b0[-1] = (long)pOVar9;
              }
              if (pOVar20 != (ON_SubDEdge *)0x0) {
                (*local_158)[0] = pOVar20;
                *local_1b0 = (long)local_1d0;
              }
              plVar13 = local_1b0;
              uVar14 = local_150;
              papOVar17 = local_158;
              if (uVar21 != 0) {
                *(ulong *)((long)*local_160 + (ulong)(uint)((int)local_1c0 << 4) + 8) = uVar21;
                uVar21 = local_150 & 0xffffffff;
                if (local_1e8 == 0) {
                  uVar21 = 0xb;
                }
                *(long *)(local_128 + uVar21 * 8) = lVar18;
              }
            }
            bVar5 = 2 < local_1e8;
            local_1e8 = local_1e8 + 1;
            uVar14 = uVar14 + 3;
            plVar13 = plVar13 + 3;
            papOVar17 = papOVar17 + 1;
          } while (local_1e8 != 4);
          this->m_face_grid[0][0] = (ON_SubDFace *)local_1a8._0_8_;
          this->m_face_grid[2][0] = (ON_SubDFace *)local_1a8._8_8_;
          this->m_face_grid[2][2] = (ON_SubDFace *)local_198._0_8_;
          this->m_face_grid[0][2] = (ON_SubDFace *)local_198._8_8_;
          this->m_vertex_grid[0][0] = (ON_SubDVertex *)local_128;
          this->m_vertex_grid[1][0] = pOStack_120;
          this->m_vertex_grid[2][0] = (ON_SubDVertex *)local_118._0_8_;
          this->m_vertex_grid[3][0] = (ON_SubDVertex *)local_118._8_8_;
          this->m_vertex_grid[3][1] = (ON_SubDVertex *)local_108._0_8_;
          this->m_vertex_grid[3][2] = (ON_SubDVertex *)local_108._8_8_;
          this->m_vertex_grid[3][3] = (ON_SubDVertex *)local_f8._0_8_;
          this->m_vertex_grid[2][3] = (ON_SubDVertex *)local_f8._8_8_;
          this->m_vertex_grid[1][3] = (ON_SubDVertex *)local_e8._0_8_;
          this->m_vertex_grid[0][3] = (ON_SubDVertex *)local_e8._8_8_;
          *(undefined4 *)(this->m_vertex_grid[0] + 1) = local_d8._8_4_;
          *(undefined4 *)((long)this->m_vertex_grid[0] + 0xc) = local_d8._4_4_;
          *(undefined4 *)(this->m_vertex_grid[0] + 2) = local_d8._0_4_;
          *(undefined4 *)((long)this->m_vertex_grid[0] + 0x14) = local_d8._4_4_;
          if (center_quad_face->m_level_zero_face_id == 0) {
            uVar6 = '\0';
          }
          else {
            uVar7 = ON_SubDComponentBase::SubdivisionLevel
                              (&center_quad_face->super_ON_SubDComponentBase);
            uVar6 = (uchar)uVar7;
          }
          this->m_initial_subdivision_level = uVar6;
          this->m_current_subdivision_level = uVar6;
          SetPatchStatus(this,0);
          goto LAB_006190e4;
        }
        lVar2 = lVar18 + -3;
        iVar1 = (int)lVar18;
        lVar3 = lVar18 + 1;
        lVar18 = lVar18 + 1;
      } while (local_148[iVar1 - 0x13U & 3] ==
               (ON_SubDVertex *)
               (*(ON_SubDVertex *(*) [4])(this->m_edge_grid + -2))[lVar3]->m_P
               [~*(uint *)((center_quad_face->super_ON_SubDComponentBase).m_saved_subd_point1 +
                          lVar2) & 1]);
    }
LAB_00618b79:
    ON_SubDIncrementErrorCount();
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ON_SubDQuadNeighborhood::Set(
  const ON_SubDFace* center_quad_face
  )
{
  ON_SubDQuadNeighborhood::Clear(this, false);

  if (nullptr == center_quad_face)
    return true;

  if (4 != center_quad_face->m_edge_count)
    return ON_SUBD_RETURN_ERROR(false);

  const ON_SubDVertex* qf_vertex[4];
  bool bIsDartVertex[4];
  bool bIsCreaseEdge[4];
  for (unsigned int qfei = 0; qfei < 4; qfei++)
  {
    const ON__UINT_PTR eptr = center_quad_face->m_edge4[qfei].m_ptr;
    const ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(eptr);
    if (nullptr == edge)
      return ON_SUBD_RETURN_ERROR(false);
    if (nullptr == edge->m_vertex[0])
      return ON_SUBD_RETURN_ERROR(false);
    if (nullptr == edge->m_vertex[1])
      return ON_SUBD_RETURN_ERROR(false);

    bIsCreaseEdge[qfei] = edge->IsCrease();

    m_center_edges[qfei] = edge;

    qf_vertex[qfei] = edge->m_vertex[ON_SUBD_EDGE_DIRECTION(eptr)];
    
    bIsDartVertex[qfei] = qf_vertex[qfei]->IsDart();
  }

  for (unsigned int qfei = 0; qfei < 4; qfei++)
  {
    ON__UINT_PTR ev1 = 1-ON_SUBD_EDGE_DIRECTION(center_quad_face->m_edge4[qfei].m_ptr);
    if ( qf_vertex[(qfei+1)%4] != m_center_edges[qfei]->m_vertex[ev1] )
      return ON_SUBD_RETURN_ERROR(false);
  }
  
  const ON_SubDFace* qf_nbr_face[4] = {};
  for (unsigned int qfei = 0; qfei < 4; qfei++)
  {
    if (bIsCreaseEdge[qfei] && false == bIsDartVertex[qfei] && false == bIsDartVertex[(qfei+1)%4])
    {
      m_bBoundaryCrease[qfei] = true;
      m_boundary_crease_count++;
      continue;
    }
    qf_nbr_face[qfei] = m_center_edges[qfei]->NeighborFace(center_quad_face, false);
  }

  ON_SubDSectorIterator sit0, sit1;

  m_face_grid[1][1] = center_quad_face;
  m_face_grid[1][0] = qf_nbr_face[0];
  m_face_grid[2][1] = qf_nbr_face[1];
  m_face_grid[1][2] = qf_nbr_face[2];
  m_face_grid[0][1] = qf_nbr_face[3];

  m_vertex_grid[1][1] = qf_vertex[0];
  m_vertex_grid[2][1] = qf_vertex[1];
  m_vertex_grid[2][2] = qf_vertex[2];
  m_vertex_grid[1][2] = qf_vertex[3];

  const ON_SubDFace* corner_faces[4] = {};
  const ON_SubDVertex* outer_vertex[12] = {};

  for (unsigned int qfei = 0; qfei < 4; qfei++)
  {
    const unsigned int qfei3 = (qfei+3)%4;

    if ( nullptr == qf_nbr_face[qfei] && nullptr == qf_nbr_face[qfei3])
      continue;

    if (nullptr == sit0.Initialize(center_quad_face, 0, qfei))
      return ON_SUBD_RETURN_ERROR(false);

    if (qf_vertex[qfei] != sit0.CenterVertex())
      return ON_SUBD_RETURN_ERROR(false);

    sit1 = sit0;

    const bool b4EdgedCorner = (4 == qf_vertex[qfei]->m_edge_count && qf_vertex[qfei]->m_face_count >= 3);
    const ON_SubDEdge* e[2] = {};
    const ON_SubDVertex* v[2] = {};
    ON__UINT_PTR eptr;

    for (;;)
    {
      if (nullptr != qf_nbr_face[qfei])
      {
        if (qf_nbr_face[qfei] != sit0.PrevFace(ON_SubDSectorIterator::StopAt::Boundary))
          return ON_SUBD_RETURN_ERROR(false);
        eptr = sit0.CurrentEdgePtr(0).m_ptr;
        e[0] = ON_SUBD_EDGE_POINTER(eptr);
        if (nullptr == e[0])
          return ON_SUBD_RETURN_ERROR(false);
        v[0] = e[0]->m_vertex[1 - ON_SUBD_EDGE_DIRECTION(eptr)];
        if (nullptr == v[0])
          return ON_SUBD_RETURN_ERROR(false);
        
        if (b4EdgedCorner)
        {
          ON_SubDSectorIterator::StopAt stop_at
            = bIsDartVertex[qfei]
            ? ON_SubDSectorIterator::StopAt::Boundary
            : ON_SubDSectorIterator::StopAt::AnyCrease
            ;
          corner_faces[qfei] = sit0.PrevFace(stop_at);
          if (nullptr != corner_faces[qfei])
          {
            eptr = sit0.CurrentEdgePtr(0).m_ptr;
            e[1] = ON_SUBD_EDGE_POINTER(eptr);
            if (nullptr == e[1])
              return ON_SUBD_RETURN_ERROR(false);
            v[1] = e[1]->m_vertex[1 - ON_SUBD_EDGE_DIRECTION(eptr)];
            if (nullptr == v[1])
              return ON_SUBD_RETURN_ERROR(false);
            break;
          }
        }
      }

      if (nullptr == e[1] && nullptr != qf_nbr_face[qfei3])
      {
        if (qf_nbr_face[qfei3] != sit1.NextFace(ON_SubDSectorIterator::StopAt::Boundary))
          return ON_SUBD_RETURN_ERROR(false);
        eptr = sit1.CurrentEdgePtr(1).m_ptr;
        e[1] = ON_SUBD_EDGE_POINTER(eptr);
        if (nullptr == e[1])
          return ON_SUBD_RETURN_ERROR(false);
        v[1] = e[1]->m_vertex[1 - ON_SUBD_EDGE_DIRECTION(eptr)];
        if (nullptr == v[1])
          return ON_SUBD_RETURN_ERROR(false);
        if (b4EdgedCorner && nullptr == corner_faces[qfei])
        {
          ON_SubDSectorIterator::StopAt stop_at
            = bIsDartVertex[qfei3]
            ? ON_SubDSectorIterator::StopAt::Boundary
            : ON_SubDSectorIterator::StopAt::AnyCrease
            ;
          corner_faces[qfei] = sit1.NextFace(stop_at);
          if (nullptr != corner_faces[qfei] && nullptr == e[0] )
          {
            eptr = sit1.CurrentEdgePtr(1).m_ptr;
            e[0] = ON_SUBD_EDGE_POINTER(eptr);
            if (nullptr == e[0])
              return ON_SUBD_RETURN_ERROR(false);
            v[0] = e[0]->m_vertex[1 - ON_SUBD_EDGE_DIRECTION(eptr)];
            if (nullptr == v[0])
              return ON_SUBD_RETURN_ERROR(false);
            break;
          }
        }
      }
      break;
    }

    if ( nullptr != corner_faces[qfei] )
      outer_vertex[3 * qfei] = corner_faces[qfei]->QuadOppositeVertex(qf_vertex[qfei]);

    if (nullptr != e[0])
    {
      m_edge_grid[qfei][0] = e[0];
      outer_vertex[3 * qfei + 1] = v[0];
    }

    if (nullptr != e[1])
    {
      m_edge_grid[qfei3][1] = e[1];
      outer_vertex[(3 * qfei + 11) % 12] = v[1];
    }   
  }

  m_face_grid[0][0] = corner_faces[0]; // lower left corner
  m_face_grid[2][0] = corner_faces[1]; // lower right corner
  m_face_grid[2][2] = corner_faces[2]; // upper right corner
  m_face_grid[0][2] = corner_faces[3]; // upper left corner

  m_vertex_grid[0][0] = outer_vertex[0]; // lower left corner
  m_vertex_grid[1][0] = outer_vertex[1];
  m_vertex_grid[2][0] = outer_vertex[2];
  
  m_vertex_grid[3][0] = outer_vertex[3]; // lower right corner
  m_vertex_grid[3][1] = outer_vertex[4];
  m_vertex_grid[3][2] = outer_vertex[5];

  m_vertex_grid[3][3] = outer_vertex[6]; // upper right corner
  m_vertex_grid[2][3] = outer_vertex[7];
  m_vertex_grid[1][3] = outer_vertex[8];
  
  m_vertex_grid[0][3] = outer_vertex[9]; // upper left corner
  m_vertex_grid[0][2] = outer_vertex[10];
  m_vertex_grid[0][1] = outer_vertex[11];

  m_initial_subdivision_level = (unsigned char)(center_quad_face->m_level_zero_face_id > 0 ? center_quad_face->SubdivisionLevel() : 0U);
  m_current_subdivision_level = m_initial_subdivision_level;
  
  SetPatchStatus(0);
  
#if defined(ON_DEBUG)
  IsValid(); // will trigger a break if "this" is not valid
#endif
  
  return true;
}